

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cpp
# Opt level: O3

void __thiscall
testing::internal::ExpectationBase::FindUnsatisfiedPrerequisites
          (ExpectationBase *this,ExpectationSet *result)

{
  long lVar1;
  long *plVar2;
  ExpectationBase *this_00;
  char cVar3;
  _Rb_tree_node_base *p_Var4;
  
  MutexBase::AssertHeld((MutexBase *)g_gmock_mutex);
  for (p_Var4 = (this->immediate_prerequisites_).expectations_._M_t._M_impl.super__Rb_tree_header.
                _M_header._M_left;
      (_Rb_tree_header *)p_Var4 !=
      &(this->immediate_prerequisites_).expectations_._M_t._M_impl.super__Rb_tree_header;
      p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
    lVar1 = *(long *)(p_Var4 + 1);
    MutexBase::AssertHeld((MutexBase *)g_gmock_mutex);
    plVar2 = *(long **)(lVar1 + 0x40);
    cVar3 = (**(code **)(*plVar2 + 0x20))(plVar2,*(undefined4 *)(lVar1 + 0x80));
    if (cVar3 == '\0') {
      std::
      _Rb_tree<testing::Expectation,testing::Expectation,std::_Identity<testing::Expectation>,testing::Expectation::Less,std::allocator<testing::Expectation>>
      ::_M_insert_unique<testing::Expectation_const&>
                ((_Rb_tree<testing::Expectation,testing::Expectation,std::_Identity<testing::Expectation>,testing::Expectation::Less,std::allocator<testing::Expectation>>
                  *)result,(Expectation *)(p_Var4 + 1));
    }
    else {
      this_00 = *(ExpectationBase **)(p_Var4 + 1);
      if (this_00->call_count_ == 0) {
        FindUnsatisfiedPrerequisites(this_00,result);
      }
    }
  }
  return;
}

Assistant:

GTEST_EXCLUSIVE_LOCK_REQUIRED_(g_gmock_mutex) {
  g_gmock_mutex.AssertHeld();
  for (ExpectationSet::const_iterator it = immediate_prerequisites_.begin();
       it != immediate_prerequisites_.end(); ++it) {
    if (it->expectation_base()->IsSatisfied()) {
      // If *it is satisfied and has a call count of 0, some of its
      // pre-requisites may not be satisfied yet.
      if (it->expectation_base()->call_count_ == 0) {
        it->expectation_base()->FindUnsatisfiedPrerequisites(result);
      }
    } else {
      // Now that we know *it is unsatisfied, we are not so interested
      // in whether its pre-requisites are satisfied.  Therefore we
      // don't recursively call FindUnsatisfiedPrerequisites() here.
      *result += *it;
    }
  }
}